

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

Value * __thiscall Kvm::readPair(Kvm *this,istream *in)

{
  bool bVar1;
  KatException *pKVar2;
  size_t in_RCX;
  void *__buf;
  void *__buf_00;
  Value *result_1;
  Value *result;
  string local_a0;
  undefined1 local_7a;
  allocator<char> local_79;
  string local_78;
  undefined4 local_58;
  undefined1 local_48 [8];
  GcGuard readGuard;
  Value *cdr_obj;
  Value *car_obj;
  istream *piStack_20;
  char c;
  istream *in_local;
  Kvm *this_local;
  
  piStack_20 = in;
  in_local = (istream *)this;
  anon_unknown.dwarf_ebf5::eatWhitespace(in);
  std::operator>>(piStack_20,(char *)((long)&car_obj + 7));
  if (car_obj._7_1_ == ')') {
    this_local = (Kvm *)this->NIL;
  }
  else {
    std::istream::putback((char)piStack_20);
    cdr_obj = (Value *)0x0;
    readGuard.times_ = 0;
    GcGuard::GcGuard((GcGuard *)local_48,&this->gc_);
    GcGuard::pushLocalStackRoot((GcGuard *)local_48,&cdr_obj);
    GcGuard::pushLocalStackRoot((GcGuard *)local_48,(Value **)&readGuard.times_);
    cdr_obj = (Value *)read(this,(int)piStack_20,__buf,in_RCX);
    if (cdr_obj == (Value *)0x0) {
      this_local = (Kvm *)0x0;
    }
    else {
      anon_unknown.dwarf_ebf5::eatWhitespace(piStack_20);
      std::operator>>(piStack_20,(char *)((long)&car_obj + 7));
      if (car_obj._7_1_ == '.') {
        car_obj._7_1_ = std::istream::peek();
        bVar1 = anon_unknown.dwarf_ebf5::isDelimiter(car_obj._7_1_);
        if (!bVar1) {
          local_7a = 1;
          pKVar2 = (KatException *)__cxa_allocate_exception(0x10);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_78,"dot not followed by delimiter",&local_79);
          anon_unknown.dwarf_ebf5::KatException::KatException(pKVar2,&local_78);
          local_7a = 0;
          __cxa_throw(pKVar2,&(anonymous_namespace)::KatException::typeinfo,
                      anon_unknown.dwarf_ebf5::KatException::~KatException);
        }
        readGuard.times_ = read(this,(int)piStack_20,__buf_00,in_RCX);
        if (readGuard.times_ == 0) {
          this_local = (Kvm *)0x0;
        }
        else {
          anon_unknown.dwarf_ebf5::eatWhitespace(piStack_20);
          std::operator>>(piStack_20,(char *)((long)&car_obj + 7));
          if (car_obj._7_1_ != ')') {
            result._6_1_ = 1;
            pKVar2 = (KatException *)__cxa_allocate_exception(0x10);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_a0,"where was the trailing paren?",
                       (allocator<char> *)((long)&result + 7));
            anon_unknown.dwarf_ebf5::KatException::KatException(pKVar2,&local_a0);
            result._6_1_ = 0;
            __cxa_throw(pKVar2,&(anonymous_namespace)::KatException::typeinfo,
                        anon_unknown.dwarf_ebf5::KatException::~KatException);
          }
          this_local = (Kvm *)makeCell(this,cdr_obj,(Value *)readGuard.times_);
        }
      }
      else {
        std::istream::putback((char)piStack_20);
        readGuard.times_ = (long)readPair(this,piStack_20);
        this_local = (Kvm *)makeCell(this,cdr_obj,(Value *)readGuard.times_);
      }
    }
    local_58 = 1;
    GcGuard::~GcGuard((GcGuard *)local_48);
  }
  return (Value *)this_local;
}

Assistant:

const Value* Kvm::readPair(std::istream &in)
{
    eatWhitespace(in);

    char c;
    in >> c;
    if (c == ')') return NIL;
    in.putback(c);

    const Value *car_obj = nullptr;
    const Value *cdr_obj = nullptr;
    GcGuard readGuard{gc_};
    readGuard.pushLocalStackRoot(&car_obj);
    readGuard.pushLocalStackRoot(&cdr_obj);

    car_obj = read(in);
    if (!car_obj) return nullptr;
    eatWhitespace(in);
    in >> c;
    if (c == '.')  /* improper list */
    {
        c = in.peek(); // FIXME: peek returns int
        if (!isDelimiter(c))
        {
            throw KatException("dot not followed by delimiter");
        }
        cdr_obj = read(in);
        if (!cdr_obj) return nullptr;
        eatWhitespace(in);
        in >> c;
        if (c != ')')
        {
            throw KatException("where was the trailing paren?");
        }
        auto result = makeCell(car_obj, cdr_obj);
        return result;
    } else /* read list */
    {
        in.putback(c);
        cdr_obj = readPair(in);
        auto result = makeCell(car_obj, cdr_obj);
        return result;
    }
}